

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O3

int ImfHeaderDoubleAttribute(ImfHeader *hdr,char *name,double *value)

{
  TypedAttribute<double> *pTVar1;
  
  pTVar1 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<double>>((Header *)hdr,name);
  *value = pTVar1->_value;
  return 1;
}

Assistant:

int
ImfHeaderDoubleAttribute (
    const ImfHeader* hdr, const char name[], double* value)
{
    try
    {
        *value = header (hdr)
                     ->typedAttribute<
                         OPENEXR_IMF_INTERNAL_NAMESPACE::DoubleAttribute> (name)
                     .value ();

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}